

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O2

bool __thiscall thread_pool::ThreadPool::TaskQueue::Pop(TaskQueue *this,function<void_()> *f)

{
  function<void_()> *__x;
  function<void_()> *pfVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->mutex);
  while( true ) {
    __x = (this->queue).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur;
    pfVar1 = (this->queue).c.
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pfVar1 != __x) break;
    if (this->is_done != false) goto LAB_001140f9;
    std::condition_variable::wait((unique_lock *)&this->is_ready);
  }
  std::function<void_()>::operator=(f,__x);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)this);
LAB_001140f9:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return pfVar1 != __x;
}

Assistant:

bool Pop(std::function<void()>* f) {
      std::unique_lock<std::mutex> lock(mutex);
      while (queue.empty() && !is_done) {
        is_ready.wait(lock);
      }
      if (queue.empty()) {
        return false;
      }
      *f = std::move(queue.front());
      queue.pop();
      return true;
    }